

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

ImageChannelValues * __thiscall
pbrt::Image::L1Error
          (ImageChannelValues *__return_storage_ptr__,Image *this,ImageChannelDesc *desc,Image *ref,
          Image *errorImage)

{
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar1;
  size_t sVar2;
  float value;
  Allocator alloc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ulong uVar5;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar6;
  int c;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  Tuple2<pbrt::Point2,_int> TVar10;
  Point2i PVar11;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  WrapMode2D local_1d8;
  Point2i vb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  WrapMode2D local_1a0;
  vector<double,_std::allocator<double>_> sumError;
  ColorEncodingHandle local_180;
  ImageChannelDesc refDesc;
  Point2i va;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [8];
  
  va.super_Tuple2<pbrt::Point2,_int>.x = 0;
  va.super_Tuple2<pbrt::Point2,_int>.y = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&sumError,(desc->offset).nStored,(value_type_conflict3 *)&va,(allocator_type *)&refDesc
            );
  ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&va,this,desc);
  requestedChannels.n = (long)local_140 - (long)va.super_Tuple2<pbrt::Point2,_int> >> 5;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       va.super_Tuple2<pbrt::Point2,_int>;
  GetChannelDesc(&refDesc,ref,requestedChannels);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&va);
  if (refDesc.offset.nStored == 0) {
    LogFatal<char_const(&)[14]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x224,"Check failed: %s",(char (*) [14])"(bool)refDesc");
  }
  TVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  vb.super_Tuple2<pbrt::Point2,_int> = (ref->resolution).super_Tuple2<pbrt::Point2,_int>;
  va.super_Tuple2<pbrt::Point2,_int> = TVar10;
  if (TVar10 == vb.super_Tuple2<pbrt::Point2,_int>) {
    if (errorImage != (Image *)0x0) {
      ChannelNames_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&vb,this);
      PVar11.super_Tuple2<pbrt::Point2,_int> = vb.super_Tuple2<pbrt::Point2,_int>;
      local_180.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      lVar9 = (long)local_1c8 - (long)vb.super_Tuple2<pbrt::Point2,_int>;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = lVar9 >> 5;
      channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     PVar11.super_Tuple2<pbrt::Point2,_int>;
      Image((Image *)&va,Float,(Point2i)TVar10,channels,&local_180,alloc);
      operator=(errorImage,(Image *)&va);
      ~Image((Image *)&va);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vb);
      TVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
    }
    for (lVar9 = 0; lVar9 < (long)TVar10 >> 0x20; lVar9 = lVar9 + 1) {
      for (uVar5 = 0; (long)uVar5 < (long)TVar10.x; uVar5 = uVar5 + 1) {
        WrapMode2D::WrapMode2D(&local_1a0,Clamp);
        PVar11.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar9 << 0x20 | uVar5);
        GetChannels((ImageChannelValues *)&va,this,PVar11,desc,local_1a0);
        WrapMode2D::WrapMode2D(&local_1d8,Clamp);
        GetChannels((ImageChannelValues *)&vb,ref,PVar11,&refDesc,local_1d8);
        for (uVar7 = 0; uVar7 < (desc->offset).nStored; uVar7 = uVar7 + 1) {
          pbVar3 = local_140;
          if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pbVar3 = local_138;
          }
          pbVar4 = local_1c8;
          if (local_1c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pbVar4 = &local_1c0;
          }
          value = *(float *)((long)&(pbVar3->_M_dataplus)._M_p + uVar7 * 4) -
                  *(float *)((long)&(pbVar4->_M_dataplus)._M_p + uVar7 * 4);
          if (ABS(value) != INFINITY) {
            sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] =
                 (double)value +
                 sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
            if (errorImage != (Image *)0x0) {
              SetChannel(errorImage,PVar11,(int)uVar7,value);
            }
          }
        }
        InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&vb);
        InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&va);
        TVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      }
    }
    ImageChannelValues::ImageChannelValues(__return_storage_ptr__,(desc->offset).nStored,0.0);
    paVar1 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
              *)(__return_storage_ptr__->
                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
    sVar2 = (desc->offset).nStored;
    paVar6 = &(__return_storage_ptr__->
              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
    if (paVar1 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                   *)0x0) {
      paVar6 = paVar1;
    }
    for (sVar8 = 0; sVar2 != sVar8; sVar8 = sVar8 + 1) {
      TVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      paVar6->fixed[sVar8] =
           (float)(sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar8] / (double)(TVar10.y * TVar10.x));
    }
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&refDesc.offset);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&sumError.super__Vector_base<double,_std::allocator<double>_>);
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[13],char_const(&)[17],char_const(&)[13],pbrt::Point2<int>&,char_const(&)[17],pbrt::Point2<int>&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,0x225,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])0x4a4d42,
             (char (*) [17])"ref.Resolution()",(char (*) [13])0x4a4d42,(Point2<int> *)&va,
             (char (*) [17])"ref.Resolution()",&vb);
}

Assistant:

ImageChannelValues Image::L1Error(const ImageChannelDesc &desc, const Image &ref,
                                  Image *errorImage) const {
    std::vector<double> sumError(desc.size(), 0.);

    ImageChannelDesc refDesc = ref.GetChannelDesc(ChannelNames(desc));
    CHECK((bool)refDesc);
    CHECK_EQ(Resolution(), ref.Resolution());

    if (errorImage)
        *errorImage = Image(PixelFormat::Float, Resolution(), ChannelNames());

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            ImageChannelValues vref = ref.GetChannels({x, y}, refDesc);

            for (int c = 0; c < desc.size(); ++c) {
                Float error = v[c] - vref[c];
                if (std::isinf(error))
                    continue;
                sumError[c] += error;
                if (errorImage)
                    errorImage->SetChannel({x, y}, c, error);
            }
        }

    ImageChannelValues error(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        error[c] = sumError[c] / (Resolution().x * Resolution().y);
    return error;
}